

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

bool __thiscall Cache::cacheSetFull(Cache *this,uint32_t set_id)

{
  uint32_t uVar1;
  bool *pbVar2;
  ulong uVar3;
  pointer pBVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = (this->policy).associativity;
  uVar5 = set_id * uVar1;
  pBVar4 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
           super__Vector_impl_data._M_start + uVar5;
  uVar3 = (ulong)(uVar1 + uVar5);
  uVar6 = (ulong)uVar5 - 1;
  do {
    uVar6 = uVar6 + 1;
    if (uVar3 <= uVar6) break;
    pbVar2 = &pBVar4->valid;
    pBVar4 = pBVar4 + 1;
  } while (*pbVar2 != false);
  return uVar3 <= uVar6;
}

Assistant:

bool Cache::cacheSetFull(uint32_t set_id) const {
    uint32_t begin = set_id * this->policy.associativity;
    uint32_t end = begin + this->policy.associativity;
    for (uint32_t i = begin; i < end; i++) {
        if (!this->blocks[i].valid)
            return false;
    }
    return true;
}